

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryLastIndexOf(RecyclableObject *function,CallInfo callInfo,...)

{
  int iVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  JavascriptArray *obj_00;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  undefined1 *puVar8;
  TypedArrayBase *pArr_00;
  JavascriptNativeIntArray *pArr_01;
  JavascriptNativeFloatArray *pArr_02;
  int in_stack_00000010;
  undefined1 local_80 [8];
  ArgumentReader args;
  int64 length;
  CallInfo callInfo_local;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  JsReentLock jsReentLock;
  Var search;
  int64 fromIndex;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length = (int64)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x12d1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b760ab;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_80 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_80,(CallInfo *)&length);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  obj = (RecyclableObject *)pSVar2->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)obj)->noJsReentrancy;
  ((ThreadContext *)obj)->noJsReentrancy = true;
  pvVar7 = Arguments::operator[]((Arguments *)local_80,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&obj,pvVar7);
  if ((length & 0x1000000U) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x12d8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b760ab;
    *puVar6 = 0;
  }
  callInfo_local = (CallInfo)0x0;
  pArr = (JavascriptArray *)0x0;
  *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
  pvVar7 = Arguments::operator[]((Arguments *)local_80,0);
  TryGetArrayAndLength<long>
            (pvVar7,pSVar2,L"Array.prototype.lastIndexOf",(JavascriptArray **)&callInfo_local,
             (RecyclableObject **)&pArr,(long *)&args.super_Arguments.Values);
  JsReentLock::MutateArrayObject((JsReentLock *)&obj);
  *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
  BVar5 = GetParamForLastIndexOf
                    ((int64)args.super_Arguments.Values,(Arguments *)local_80,
                     (Var *)&jsReentLock.m_savedNoJsReentrancy,(int64 *)&search,pSVar2);
  JsReentLock::MutateArrayObject((JsReentLock *)&obj);
  *(undefined1 *)&obj[0x10].type.ptr = 1;
  if (BVar5 == 0) {
    puVar8 = &DAT_10000ffffffff;
  }
  else {
    if (callInfo_local != (CallInfo)0x0) {
      bVar4 = IsNonES5Array(pArr);
      if (bVar4) {
        if (callInfo_local != (CallInfo)0x0) {
          iVar1 = **(int **)((long)callInfo_local + 8);
          if (iVar1 == 0x20) {
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
            pArr_02 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                                ((JavascriptArray *)callInfo_local);
            puVar8 = (undefined1 *)
                     LastIndexOfHelper<Js::JavascriptNativeFloatArray>
                               (pArr_02,(Var)jsReentLock._24_8_,(int64)search,pSVar2);
          }
          else if (iVar1 == 0x1e) {
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
            pArr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                                ((JavascriptArray *)callInfo_local);
            puVar8 = (undefined1 *)
                     LastIndexOfHelper<Js::JavascriptNativeIntArray>
                               (pArr_01,(Var)jsReentLock._24_8_,(int64)search,pSVar2);
          }
          else if (iVar1 == 0x1d) {
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
            puVar8 = (undefined1 *)
                     LastIndexOfHelper<Js::JavascriptArray>
                               ((JavascriptArray *)callInfo_local,(Var)jsReentLock._24_8_,
                                (int64)search,pSVar2);
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x12fb,"(0)","invalid array typeid");
            if (!bVar4) goto LAB_00b760ab;
            *puVar6 = 0;
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
            puVar8 = (undefined1 *)
                     LastIndexOfHelper<Js::JavascriptArray>
                               ((JavascriptArray *)callInfo_local,(Var)jsReentLock._24_8_,
                                (int64)search,pSVar2);
          }
          goto LAB_00b75fce;
        }
      }
      else {
        bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)pArr);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x12ec,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar4) {
LAB_00b760ab:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        callInfo_local = (CallInfo)0x0;
      }
    }
    obj_00 = pArr;
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pArr);
    if (bVar4) {
      pArr_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj_00);
      if (pArr_00 != (TypedArrayBase *)0x0) {
        *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
        puVar8 = (undefined1 *)
                 LastIndexOfHelper<Js::TypedArrayBase>
                           (pArr_00,(Var)jsReentLock._24_8_,(int64)search,pSVar2);
        goto LAB_00b75fce;
      }
    }
    *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
    puVar8 = (undefined1 *)
             LastIndexOfHelper<Js::RecyclableObject>
                       ((RecyclableObject *)pArr,(Var)jsReentLock._24_8_,(int64)search,pSVar2);
  }
LAB_00b75fce:
  *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
  return puVar8;
}

Assistant:

Var JavascriptArray::EntryLastIndexOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_LastIndexOf);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_lastIndexOf);

        Assert(!(callInfo.Flags & CallFlags_New));

        int64 length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.lastIndexOf"), &pArr, &obj, &length));

        Var search;
        int64 fromIndex;
        JS_REENTRANT(jsReentLock,
            BOOL gotParam = GetParamForLastIndexOf(length, args, search, fromIndex, scriptContext));
        if (!gotParam)
        {
            return TaggedInt::ToVarUnchecked(-1);
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of fromIndex argument may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            switch (pArr->GetTypeId())
            {
            case Js::TypeIds_Array:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(pArr, search, fromIndex, scriptContext));
            case Js::TypeIds_NativeIntArray:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(UnsafeVarTo<JavascriptNativeIntArray>(pArr), search, fromIndex, scriptContext));
            case Js::TypeIds_NativeFloatArray:
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(UnsafeVarTo<JavascriptNativeFloatArray>(pArr), search, fromIndex, scriptContext));
            default:
                AssertMsg(FALSE, "invalid array typeid");
                JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(pArr, search, fromIndex, scriptContext));
            }
        }

        // source object is not a JavascriptArray but source could be a TypedArray
        TypedArrayBase * typedArrayObj = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(obj);
        if (typedArrayObj)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(typedArrayObj, search, fromIndex, scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return LastIndexOfHelper(obj, search, fromIndex, scriptContext));
        JIT_HELPER_END(Array_LastIndexOf);
    }